

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.h
# Opt level: O2

bool testing::internal::
     TypeParameterizedTest<NumericArgTest,_testing::internal::TemplateSel<NumericArgTest_MakeAndVisit_Test>,_testing::internal::Types6<unsigned_long,_long_long,_unsigned_long_long,_float,_double,_long_double>_>
     ::Register(char *prefix,char *case_name,char *test_names,int index)

{
  bool bVar1;
  TestFactoryBase *factory;
  char *__rhs;
  char *str;
  allocator local_135;
  int index_local;
  char *local_130 [4];
  string local_110;
  string local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  index_local = index;
  std::__cxx11::string::string((string *)&local_50,prefix,&local_135);
  __rhs = "/";
  if (*prefix == '\0') {
    __rhs = "";
  }
  std::operator+(&local_d0,&local_50,__rhs);
  std::operator+(&local_b0,&local_d0,case_name);
  std::operator+(&local_90,&local_b0,"/");
  StreamableToString<int>(&local_f0,&index_local);
  std::operator+(&local_70,&local_90,&local_f0);
  GetPrefixUntilComma_abi_cxx11_(&local_110,(internal *)test_names,str);
  GetTypeName<unsigned_long>();
  factory = (TestFactoryBase *)operator_new(8);
  factory->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_001b8bc0;
  MakeAndRegisterTestInfo
            (local_70._M_dataplus._M_p,local_110._M_dataplus._M_p,local_130[0],(char *)0x0,
             &TypeIdHelper<NumericArgTest<unsigned_long>>::dummy_,Test::SetUpTestCase,
             Test::TearDownTestCase,factory);
  std::__cxx11::string::~string((string *)local_130);
  std::__cxx11::string::~string((string *)&local_110);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_f0);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_d0);
  std::__cxx11::string::~string((string *)&local_50);
  bVar1 = TypeParameterizedTest<NumericArgTest,_testing::internal::TemplateSel<NumericArgTest_MakeAndVisit_Test>,_testing::internal::Types5<long_long,_unsigned_long_long,_float,_double,_long_double>_>
          ::Register(prefix,case_name,test_names,index_local + 1);
  return bVar1;
}

Assistant:

static bool Register(const char* prefix, const char* case_name,
                       const char* test_names, int index) {
    typedef typename Types::Head Type;
    typedef Fixture<Type> FixtureClass;
    typedef typename GTEST_BIND_(TestSel, Type) TestClass;

    // First, registers the first type-parameterized test in the type
    // list.
    MakeAndRegisterTestInfo(
        (std::string(prefix) + (prefix[0] == '\0' ? "" : "/") + case_name + "/"
         + StreamableToString(index)).c_str(),
        GetPrefixUntilComma(test_names).c_str(),
        GetTypeName<Type>().c_str(),
        NULL,  // No value parameter.
        GetTypeId<FixtureClass>(),
        TestClass::SetUpTestCase,
        TestClass::TearDownTestCase,
        new TestFactoryImpl<TestClass>);

    // Next, recurses (at compile time) with the tail of the type list.
    return TypeParameterizedTest<Fixture, TestSel, typename Types::Tail>
        ::Register(prefix, case_name, test_names, index + 1);
  }